

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O1

void test_parallel_for_each(void)

{
  uint64_t uid;
  bool bVar1;
  ulong uVar2;
  undefined4 uVar3;
  element_type *peVar4;
  uint uVar5;
  undefined8 *puVar6;
  long *plVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  timing_registry *this;
  uint uVar9;
  size_type *psVar10;
  task_group_base *ptVar11;
  parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *ppVar12;
  _func_int **pp_Var13;
  undefined8 uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  uint uVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  long lVar16;
  ulong uVar17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  uint uVar19;
  uint uVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  test __t;
  undefined1 local_3d0 [32];
  uint local_3b0;
  uint __uval;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a8;
  long local_3a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_398;
  group_context_base local_388;
  long local_380;
  undefined1 local_378 [16];
  parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_360 [2];
  string __str_1;
  string __str;
  shared_ptr<oqpi::simple_partitioner> spPartitioner;
  simple_partitioner local_2fc;
  long *local_2e0;
  long local_2d8;
  long local_2d0 [2];
  task_handle local_2c0;
  atomic<unsigned_long> count;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  string local_250 [16];
  undefined1 local_240 [16];
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  task_handle **local_210 [2];
  task_handle *local_200 [2];
  task_handle **local_1f0 [2];
  task_handle *local_1e0 [2];
  string local_1d0 [16];
  __pthread_internal_list local_1c0;
  task_handle *local_1b0 [2];
  task_handle local_1a0;
  task_handle *local_190 [2];
  task_handle local_180;
  undefined1 local_170 [48];
  __pthread_internal_list local_140;
  task_handle *local_130 [2];
  task_handle local_120;
  task_handle *local_110 [2];
  task_handle local_100;
  string local_f0 [16];
  undefined1 local_e0 [16];
  task_handle **local_d0 [2];
  task_handle *local_c0 [2];
  task_handle *local_b0 [2];
  task_handle local_a0;
  task_handle *local_90 [2];
  task_handle local_80;
  string local_70 [16];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  test::test(&__t,"test_parallel_for_each");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Lorem ipsum dolor","");
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270," sit amet, consectetur","");
  local_250._0_8_ = local_240;
  std::__cxx11::string::_M_construct<char_const*>(local_250," adipiscing elit.","");
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Nullam nulla sapien,","");
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210," mattis a egestas id,","");
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0," lobortis ut mauris.","");
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>(local_1d0,"Proin consectetur finibus diam,","");
  local_1b0[0] = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0," eu maximus velit interdum sed.","");
  local_190[0] = &local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"Quisque massa nibh, molestie vitae","");
  local_170._0_8_ = local_170 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_170," volutpat sed, lacinia non odio.","");
  local_170._32_8_ = &local_140;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_170 + 0x20),"Aenean dui enim, porttitor quis velit quis,","");
  local_130[0] = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130," lacinia viverra ex.","");
  local_110[0] = &local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"Vivamus et libero sit amet orci consequat consectetur.","");
  local_f0._0_8_ = local_e0;
  std::__cxx11::string::_M_construct<char_const*>(local_f0,"Duis eu porttitor nunc,","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0," nec scelerisque mi.Cras efficitur lobortis elit, id","");
  local_b0[0] = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0," scelerisque diam interdum ut.","");
  local_90[0] = &local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"Quisque blandit sodales venenatis.","");
  local_70._0_8_ = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            (local_70,"Ut at purus congue dolor cursus posuere.","");
  plVar7 = local_40;
  local_50[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Aliquam ac volutpat turpis, ac placerat nisl.","");
  __l._M_len = 0x13;
  __l._M_array = &local_290;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vec,__l,(allocator_type *)local_3d0);
  lVar16 = -0x260;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0);
  count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_2e0 = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,"FibonacciParallelForEach","");
  uVar3 = oqpi::
          helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
          ::scheduler_._32_4_;
  uVar17 = (ulong)((long)vec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vec.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 5;
  local_2fc.super_base_partitioner.firstIndex_ = 0;
  uVar15 = (uint)uVar17;
  if ((int)uVar15 <
      (int)oqpi::
           helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
           ::scheduler_._32_4_) {
    local_2fc.nbElementsPerBatch_ = 1;
    local_2fc.remainder_ = 0;
    local_3b0 = uVar15;
  }
  else {
    uVar2 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
    local_2fc.remainder_ =
         (int32_t)((long)uVar2 %
                  (long)(int)oqpi::
                             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                             ::scheduler_._32_4_);
    local_2fc.nbElementsPerBatch_ =
         (int32_t)((long)uVar2 /
                  (long)(int)oqpi::
                             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                             ::scheduler_._32_4_);
    local_3b0 = oqpi::
                helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                ::scheduler_._32_4_;
  }
  local_2fc.batchIndex_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  local_2fc.super_base_partitioner.lastIndex_ = uVar15;
  local_2fc.super_base_partitioner.elementCount_ = uVar15;
  local_2fc.super_base_partitioner.batchCount_ = local_3b0;
  if ((int)uVar15 < 1) {
    ppVar12 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               *)0x0;
    _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0016c6ab;
  }
  local_3a8._M_pi = &local_398;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,local_2e0,local_2d8 + (long)local_2e0);
  std::__cxx11::string::append((char *)&local_3a8);
  uVar19 = 1;
  if (9 < uVar15) {
    uVar20 = 4;
    do {
      uVar19 = uVar20;
      uVar9 = (uint)uVar17;
      if (uVar9 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_0016bfcc;
      }
      if (uVar9 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_0016bfcc;
      }
      if (uVar9 < 10000) goto LAB_0016bfcc;
      uVar17 = (uVar17 & 0xffffffff) / 10000;
      uVar20 = uVar19 + 4;
    } while (99999 < uVar9);
    uVar19 = uVar19 + 1;
  }
LAB_0016bfcc:
  local_388.pOwner_ = (task_group_base *)local_378;
  std::__cxx11::string::_M_construct((ulong)&local_388,(char)uVar19);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_388.pOwner_,uVar19,uVar15);
  pp_Var13 = (_func_int **)0xf;
  if (local_3a8._M_pi != &local_398) {
    pp_Var13 = local_398._vptr__Sp_counted_base;
  }
  if (pp_Var13 < (_func_int **)(local_380 + local_3a0)) {
    pp_Var13 = (_func_int **)0xf;
    if (local_388.pOwner_ != (task_group_base *)local_378) {
      pp_Var13 = (_func_int **)local_378._0_8_;
    }
    if (pp_Var13 < (_func_int **)(local_380 + local_3a0)) goto LAB_0016c039;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_3a8._M_pi);
  }
  else {
LAB_0016c039:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_388.pOwner_);
  }
  local_3d0._0_8_ = local_3d0 + 0x10;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_3d0._16_8_ = *plVar7;
    local_3d0._24_8_ = puVar6[3];
  }
  else {
    local_3d0._16_8_ = *plVar7;
    local_3d0._0_8_ = (long *)*puVar6;
  }
  local_3d0._8_8_ = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_3d0);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_290.field_2._M_allocated_capacity = *psVar10;
    local_290.field_2._8_8_ = plVar7[3];
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar10;
    local_290._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_290._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if (local_388.pOwner_ != (task_group_base *)local_378) {
    operator_delete(local_388.pOwner_,local_378._0_8_ + 1);
  }
  if (local_3a8._M_pi != &local_398) {
    operator_delete(local_3a8._M_pi,(long)local_398._vptr__Sp_counted_base + 1);
  }
  __str._M_dataplus._M_p._0_1_ = 2;
  local_3d0._0_4_ = local_3b0;
  local_3a8._M_pi = local_3a8._M_pi & 0xffffffff00000000;
  local_368 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,std::allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>>,oqpi::scheduler<concurrent_queue>&,std::__cxx11::string_const&,oqpi::task_priority&,int&,int&>
            (a_Stack_360,&local_368,
             (allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
              *)&local_388,
             (scheduler<concurrent_queue> *)
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_,&local_290,(task_priority *)&__str,(int *)local_3d0,(int *)&local_3a8);
  std::
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
  ::
  _M_enable_shared_from_this_with<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>>
            ((__shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_368,local_368);
  spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oqpi::simple_partitioner,std::allocator<oqpi::simple_partitioner>,oqpi::simple_partitioner_const&>
            (&spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(simple_partitioner **)&spPartitioner,
             (allocator<oqpi::simple_partitioner> *)local_3d0,&local_2fc);
  if (0 < (int)uVar3) {
    uVar15 = local_3b0;
    uVar19 = 0;
    do {
      __uval = uVar19 + 1;
      uVar20 = 1;
      if (8 < uVar19) {
        uVar9 = __uval;
        uVar5 = 4;
        do {
          uVar20 = uVar5;
          if (uVar9 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_0016c24d;
          }
          if (uVar9 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_0016c24d;
          }
          if (uVar9 < 10000) goto LAB_0016c24d;
          bVar1 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          uVar5 = uVar20 + 4;
        } while (bVar1);
        uVar20 = uVar20 + 1;
      }
LAB_0016c24d:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p,uVar20,__uval);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x1c989b);
      local_388.pOwner_ = (task_group_base *)local_378;
      ptVar11 = (task_group_base *)(plVar7 + 2);
      if ((task_group_base *)*plVar7 == ptVar11) {
        local_378._0_8_ = (ptVar11->super_task_base)._vptr_task_base;
        local_378._8_8_ = plVar7[3];
      }
      else {
        local_378._0_8_ = (ptVar11->super_task_base)._vptr_task_base;
        local_388.pOwner_ = (task_group_base *)*plVar7;
      }
      local_380 = plVar7[1];
      *plVar7 = (long)ptVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar7 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7 == p_Var8) {
        local_398._vptr__Sp_counted_base = p_Var8->_vptr__Sp_counted_base;
        local_398._8_8_ = plVar7[3];
        local_3a8._M_pi = &local_398;
      }
      else {
        local_398._vptr__Sp_counted_base = p_Var8->_vptr__Sp_counted_base;
        local_3a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7;
      }
      local_3a0 = plVar7[1];
      *plVar7 = (long)p_Var8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar20 = 1;
      if (9 < uVar15) {
        uVar17 = (ulong)uVar15;
        uVar9 = 4;
        do {
          uVar20 = uVar9;
          uVar5 = (uint)uVar17;
          if (uVar5 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_0016c386;
          }
          if (uVar5 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_0016c386;
          }
          if (uVar5 < 10000) goto LAB_0016c386;
          uVar17 = uVar17 / 10000;
          uVar9 = uVar20 + 4;
        } while (99999 < uVar5);
        uVar20 = uVar20 + 1;
      }
LAB_0016c386:
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_1,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(__str_1._M_dataplus._M_p,uVar20,uVar15);
      pp_Var13 = (_func_int **)0xf;
      if (local_3a8._M_pi != &local_398) {
        pp_Var13 = local_398._vptr__Sp_counted_base;
      }
      if (pp_Var13 < (_func_int **)(__str_1._M_string_length + local_3a0)) {
        uVar14 = (_func_int **)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          uVar14 = __str_1.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < (_func_int **)(__str_1._M_string_length + local_3a0)) goto LAB_0016c411;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&__str_1,0,(char *)0x0,(ulong)local_3a8._M_pi);
      }
      else {
LAB_0016c411:
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_3a8,(ulong)__str_1._M_dataplus._M_p);
      }
      ppVar12 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                 *)(plVar7 + 2);
      if ((parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)*plVar7 == ppVar12) {
        local_3d0._16_8_ =
             (ppVar12->
             super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             ).super_task_group_base.super_task_base._vptr_task_base;
        local_3d0._24_8_ = plVar7[3];
        local_3d0._0_8_ =
             (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *)(local_3d0 + 0x10);
      }
      else {
        local_3d0._16_8_ =
             (ppVar12->
             super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             ).super_task_group_base.super_task_base._vptr_task_base;
        local_3d0._0_8_ =
             (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *)*plVar7;
      }
      local_3d0._8_8_ = plVar7[1];
      *plVar7 = (long)ppVar12;
      plVar7[1] = 0;
      *(undefined1 *)
       &(ppVar12->
        super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
        ).super_task_group_base.super_task_base._vptr_task_base = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      if (local_3a8._M_pi != &local_398) {
        operator_delete(local_3a8._M_pi,(long)local_398._vptr__Sp_counted_base + 1);
      }
      if (local_388.pOwner_ != (task_group_base *)local_378) {
        operator_delete(local_388.pOwner_,local_378._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      _Var18._M_pi = spPartitioner.
                     super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      peVar4 = spPartitioner.
               super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (spPartitioner.
                super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (spPartitioner.
                super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      p_Var8->_M_use_count = 1;
      p_Var8->_M_weak_count = 1;
      p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f9390;
      p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_base_001f9078;
      LOCK();
      UNLOCK();
      uVar3 = oqpi::task_base::uid_provider()::uid_generator._4_4_;
      lVar16 = oqpi::task_base::uid_provider()::uid_generator + 1;
      p_Var8[1]._M_use_count = (undefined4)oqpi::task_base::uid_provider()::uid_generator;
      oqpi::task_base::uid_provider()::uid_generator = lVar16;
      p_Var8[1]._M_weak_count = uVar3;
      p_Var8[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var8[2]._M_use_count = 0;
      p_Var8[2]._M_weak_count = 0;
      *(undefined2 *)&p_Var8[3]._vptr__Sp_counted_base = 2;
      *(undefined1 *)((long)&p_Var8[3]._vptr__Sp_counted_base + 2) = 0;
      p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f93e0;
      *(element_type **)&p_Var8[3]._M_use_count = (element_type *)(p_Var8 + 1);
      this = timing_registry::get();
      uid._0_4_ = p_Var8[1]._M_use_count;
      uid._4_4_ = p_Var8[1]._M_weak_count;
      timing_registry::registerTask(this,uid,(string *)local_3d0);
      p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f93e0;
      *(uint *)&p_Var8[4]._vptr__Sp_counted_base = uVar19;
      *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        **)&p_Var8[4]._M_use_count = &vec;
      p_Var8[5]._vptr__Sp_counted_base = (_func_int **)&count;
      *(element_type **)&p_Var8[5]._M_use_count = peVar4;
      p_Var8[6]._vptr__Sp_counted_base = (_func_int **)_Var18._M_pi;
      local_2c0.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var8 + 1);
      local_2c0.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var8;
      oqpi::
      task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
      ::addTask(&local_368->
                 super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                ,&local_2c0);
      uVar15 = local_3b0;
      if (local_2c0.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2c0.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)local_3d0._0_8_ !=
          (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)(local_3d0 + 0x10)) {
        operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      }
      uVar19 = __uval;
    } while (__uval != uVar15);
  }
  _Var18._M_pi = a_Stack_360[0]._M_pi;
  ppVar12 = local_368;
  local_368 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               *)0x0;
  a_Stack_360[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (spPartitioner.
               super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (a_Stack_360[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_360[0]._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
LAB_0016c6ab:
  if (ppVar12 !=
      (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
       *)0x0) {
    if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var18._M_pi)->_M_use_count = (_Var18._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var18._M_pi)->_M_use_count = (_Var18._M_pi)->_M_use_count + 1;
      }
    }
    local_3d0._0_8_ = ppVar12;
    local_3d0._8_8_ = _Var18._M_pi;
    oqpi::scheduler<concurrent_queue>::add
              ((scheduler<concurrent_queue> *)&local_290,
               (task_handle *)
               oqpi::
               helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
               ::scheduler_);
    oqpi::task_handle::validate((task_handle *)&local_290);
    (**(code **)(*(size_type *)local_290._M_dataplus._M_p + 0x28))();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._M_string_length);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d0._8_8_);
    }
  }
  if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
  }
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0,local_2d0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vec);
  test::~test(&__t);
  return;
}

Assistant:

void test_parallel_for_each()
{
    TEST_FUNC;

    std::vector<std::string> vec
    {
        "Lorem ipsum dolor",
        " sit amet, consectetur",
        " adipiscing elit.",
        "Nullam nulla sapien,",
        " mattis a egestas id,",
        " lobortis ut mauris.",
        "Proin consectetur finibus diam,",
        " eu maximus velit interdum sed.",
        "Quisque massa nibh, molestie vitae",
        " volutpat sed, lacinia non odio.",
        "Aenean dui enim, porttitor quis velit quis,",
        " lacinia viverra ex.",
        "Vivamus et libero sit amet orci consequat consectetur.",
        "Duis eu porttitor nunc,",
        " nec scelerisque mi.Cras efficitur lobortis elit, id",
        " scelerisque diam interdum ut.",
        "Quisque blandit sodales venenatis.",
        "Ut at purus congue dolor cursus posuere.",
        "Aliquam ac volutpat turpis, ac placerat nisl."
    };
    const auto vecSize = int32_t(vec.size());
    std::atomic<uint64_t> count = 0;

    oqpi_tk::parallel_for_each("FibonacciParallelForEach", vec,
        [&count](const std::string &s)
    {
        uint64_t total = 0;
        for (auto c : s)
        {
            total += uint64_t(c) * 100;
        }
        count += fibonacci(total);
    });
}